

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_io.c
# Opt level: O1

int CVodeGetNumLinSolvSetups(void *cvode_mem,long *nlinsetups)

{
  int iVar1;
  
  if (cvode_mem == (void *)0x0) {
    iVar1 = -0x15;
    cvProcessError((CVodeMem)0x0,-0x15,"CVODE","CVodeGetNumLinSolvSetups",
                   "cvode_mem = NULL illegal.");
  }
  else {
    *nlinsetups = *(long *)((long)cvode_mem + 0x388);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int CVodeGetNumLinSolvSetups(void *cvode_mem, long int *nlinsetups)
{
  CVodeMem cv_mem;

  if (cvode_mem==NULL) {
    cvProcessError(NULL, CV_MEM_NULL, "CVODE", "CVodeGetNumLinSolvSetups", MSGCV_NO_MEM);
    return(CV_MEM_NULL);
  }

  cv_mem = (CVodeMem) cvode_mem;

  *nlinsetups = cv_mem->cv_nsetups;

  return(CV_SUCCESS);
}